

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mt19937_64.hpp
# Opt level: O0

basic_ostream<char,_std::char_traits<char>_> *
trng::operator<<(basic_ostream<char,_std::char_traits<char>_> *out,status_type *S)

{
  fmtflags __fmtfl;
  _Ios_Fmtflags _Var1;
  ostream *this;
  ostream *poVar2;
  io_range<const_unsigned_long_*> *IO_range;
  basic_ostream<char,_std::char_traits<char>_> *pbVar3;
  int *in_RSI;
  ostream *in_RDI;
  fmtflags flags;
  basic_ostream<char,_std::char_traits<char>_> *in_stack_ffffffffffffffd0;
  
  __fmtfl = Catch::clara::std::ios_base::flags
                      ((ios_base *)(in_RDI + *(long *)(*(long *)in_RDI + -0x18)));
  this = in_RDI + *(long *)(*(long *)in_RDI + -0x18);
  _Var1 = Catch::clara::std::operator|(_S_dec,_S_fixed);
  _Var1 = Catch::clara::std::operator|(_Var1,_S_left);
  Catch::clara::std::ios_base::flags((ios_base *)this,_Var1);
  poVar2 = std::operator<<(in_RDI,'(');
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*in_RSI);
  IO_range = (io_range<const_unsigned_long_*> *)std::operator<<(poVar2,' ');
  utility::make_io_range<unsigned_long_const*>
            ((unsigned_long *)in_stack_ffffffffffffffd0,(unsigned_long *)IO_range,(char *)this);
  pbVar3 = utility::operator<<(in_stack_ffffffffffffffd0,IO_range);
  std::operator<<((ostream *)pbVar3,')');
  Catch::clara::std::ios_base::flags
            ((ios_base *)(in_RDI + *(long *)(*(long *)in_RDI + -0x18)),__fmtfl);
  return (basic_ostream<char,_std::char_traits<char>_> *)in_RDI;
}

Assistant:

std::basic_ostream<char_t, traits_t> &operator<<(
          std::basic_ostream<char_t, traits_t> &out, const status_type &S) {
        std::ios_base::fmtflags flags(out.flags());
        out.flags(std::ios_base::dec | std::ios_base::fixed | std::ios_base::left);
        out << '(' << S.mti << ' ' << utility::make_io_range(S.mt, S.mt + N, " ") << ')';
        out.flags(flags);
        return out;
      }